

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_baa8f::testVectorFilter(void)

{
  char cVar1;
  bool bVar2;
  Value *this;
  ostream *poVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  Value v;
  cmJSONState state;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  *local_118;
  ValueHolder local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  Value local_a0;
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  local_78;
  vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_> vStack_60;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  Json::Value::Value(&local_a0,arrayValue);
  vStack_60.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_60.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_60.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  Json::Value::Value((Value *)local_110,"Hello");
  Json::Value::append(&local_a0,(Value *)local_110);
  Json::Value::~Value((Value *)local_110);
  Json::Value::Value((Value *)local_110,"world!");
  Json::Value::append(&local_a0,(Value *)local_110);
  Json::Value::~Value((Value *)local_110);
  Json::Value::Value((Value *)local_110,"ignore");
  Json::Value::append(&local_a0,(Value *)local_110);
  Json::Value::~Value((Value *)local_110);
  local_110[0].string_ = (char *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"default","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,__l,(allocator_type *)&local_b8);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0].string_,local_100[0] + 1);
  }
  local_110[0].string_ = (char *)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Hello","");
  plVar6 = local_e0;
  local_f0[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"world!","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8,__l_00,(allocator_type *)&local_118);
  lVar5 = -0x40;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_110[0].string_ = (char *)&local_a0;
  if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b4eb0;
  local_118 = &local_78;
  cVar1 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_d0,local_110,
                     &local_118);
  if (cVar1 == '\0') {
    iVar4 = 0x16a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(StringVectorFilterHelper(l, &v, &state)) failed on line ",0x44);
  }
  else {
    if ((long)local_d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_d0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (bVar2) {
        Json::Value::Value((Value *)local_110,2);
        this = Json::Value::operator[](&local_a0,1);
        Json::Value::operator=(this,(Value *)local_110);
        Json::Value::~Value((Value *)local_110);
        local_110[0].string_ = (char *)local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"default","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d0,
                   local_110,local_f0);
        if (local_110[0] != local_100) {
          operator_delete(local_110[0].string_,local_100[0] + 1);
        }
        local_110[0].string_ = (char *)&local_a0;
        if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0) {
LAB_001b4eb0:
          local_118 = &local_78;
          std::__throw_bad_function_call();
        }
        local_118 = &local_78;
        cVar1 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_d0,
                           local_110,&local_118);
        if (cVar1 == '\0') {
          Json::Value::Value((Value *)local_110,"Hello");
          Json::Value::operator=(&local_a0,(Value *)local_110);
          Json::Value::~Value((Value *)local_110);
          local_110[0].string_ = (char *)local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"default","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d0,
                     local_110,local_f0);
          if (local_110[0] != local_100) {
            operator_delete(local_110[0].string_,local_100[0] + 1);
          }
          local_110[0].string_ = (char *)&local_a0;
          if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0)
          goto LAB_001b4eb0;
          local_118 = &local_78;
          cVar1 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                            ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_d0,
                             local_110,&local_118);
          if (cVar1 == '\0') {
            local_110[0].string_ = (char *)local_100;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"default","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_d0,local_110,local_f0);
            if (local_110[0] != local_100) {
              operator_delete(local_110[0].string_,local_100[0] + 1);
            }
            local_110[0].int_ = 0;
            if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0)
            goto LAB_001b4eb0;
            local_118 = &local_78;
            cVar1 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                              ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_d0,
                               local_110,&local_118);
            if (cVar1 == '\0') {
              iVar4 = 0x176;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr, &state)) failed on line "
                         ,0x49);
            }
            else {
              if (local_d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar2 = true;
                goto LAB_001b4cab;
              }
              iVar4 = 0x177;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ",0x26);
            }
          }
          else {
            iVar4 = 0x173;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line ",0x45)
            ;
          }
        }
        else {
          iVar4 = 0x16f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state)) failed on line ",0x45);
        }
        goto LAB_001b4c87;
      }
    }
    iVar4 = 0x16b;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ",0x2a);
  }
LAB_001b4c87:
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar2 = false;
LAB_001b4cab:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector(&vStack_60);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector(&local_78);
  Json::Value::~Value(&local_a0);
  return bVar2;
}

Assistant:

bool testVectorFilter()
{
  Json::Value v(Json::arrayValue);
  cmJSONState state;
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{
    "Hello",
    "world!",
  };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v, &state));
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state));

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(!StringVectorFilterHelper(l, &v, &state));

  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, nullptr, &state));
  ASSERT_TRUE(l.empty());

  return true;
}